

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O0

int ffgsvb(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
          uchar nulval,uchar *array,int *anynul,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long *in_RCX;
  uint in_EDX;
  void *unaff_RBP;
  int in_ESI;
  long in_R8;
  fitsfile *in_R9;
  void *unaff_R14;
  char *unaff_retaddr;
  long *in_stack_00000008;
  undefined1 in_stack_00000010;
  undefined7 in_stack_00000011;
  undefined4 *in_stack_00000020;
  int *in_stack_00000028;
  uchar nullvalue;
  int nullcheck;
  char msg [81];
  char ldummy;
  int anyf;
  int hdutype;
  LONGLONG trcll [9];
  LONGLONG blcll [9];
  LONGLONG dsize [10];
  LONGLONG felem;
  long numcol;
  long ninc;
  long nultyp;
  long nelem;
  long dir [9];
  long incr [9];
  long stp [9];
  long str [9];
  long rinc;
  long rstp;
  long rstr;
  long row;
  long i8;
  long i7;
  long i6;
  long i5;
  long i4;
  long i3;
  long i2;
  long i1;
  long i0;
  long ii;
  long in_stack_00006f10;
  LONGLONG in_stack_00006f18;
  LONGLONG in_stack_00006f20;
  LONGLONG in_stack_00006f28;
  int in_stack_00006f34;
  fitsfile *in_stack_00006f38;
  int in_stack_00006f80;
  uchar in_stack_00006f88;
  uchar *in_stack_00006f90;
  char *in_stack_00006f98;
  int *in_stack_00006fa0;
  int *in_stack_00006fa8;
  fitsfile *in_stack_fffffffffffffc48;
  int *in_stack_fffffffffffffc50;
  fitsfile *in_stack_fffffffffffffc58;
  char local_378 [88];
  int local_320;
  int local_31c;
  undefined8 local_318 [10];
  undefined8 local_2c8 [10];
  long alStack_278 [11];
  long local_220;
  long local_218;
  long local_210;
  undefined8 local_208;
  long local_200;
  long local_1f8 [10];
  long local_1a8 [10];
  long local_158 [10];
  long local_108 [10];
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  undefined8 in_stack_ffffffffffffff90;
  long *in_stack_ffffffffffffff98;
  LONGLONG *in_stack_ffffffffffffffa0;
  LONGLONG *in_stack_ffffffffffffffa8;
  long lVar4;
  int local_1c;
  
  if (((int)in_EDX < 1) || (9 < (int)in_EDX)) {
    snprintf(local_378,0x51,"NAXIS = %d in call to ffgsvb is out of range",(ulong)in_EDX);
    ffpmsg((char *)0x18f375);
    *in_stack_00000028 = 0x140;
    local_1c = 0x140;
  }
  else {
    iVar1 = fits_is_compressed_image(in_stack_fffffffffffffc48,(int *)0x18f3a8);
    if (iVar1 == 0) {
      iVar1 = ffghdt(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                     &in_stack_fffffffffffffc48->HDUposition);
      if (iVar1 < 1) {
        if (local_31c == 0) {
          if (in_ESI == 0) {
            local_a8 = 1;
            local_b0 = 1;
          }
          else {
            local_a8 = (long)in_ESI;
            local_b0 = (long)in_ESI;
          }
          local_b8 = 1;
          local_218 = 2;
        }
        else {
          local_a8 = *(long *)(in_R8 + (long)(int)in_EDX * 8);
          local_b0 = *(long *)(&in_R9->HDUposition + (long)(int)in_EDX * 2);
          local_b8 = in_stack_00000008[(int)in_EDX];
          local_218 = (long)in_ESI;
        }
        local_208 = 1;
        if (in_stack_00000020 != (undefined4 *)0x0) {
          *in_stack_00000020 = 0;
        }
        for (lVar4 = 0; lVar4 < 9; lVar4 = lVar4 + 1) {
          local_108[lVar4] = 1;
          local_158[lVar4] = 1;
          local_1a8[lVar4] = 1;
          alStack_278[lVar4] = 1;
          local_1f8[lVar4] = 1;
        }
        for (lVar4 = 0; lVar4 < (int)in_EDX; lVar4 = lVar4 + 1) {
          if (*(long *)(&in_R9->HDUposition + lVar4 * 2) < *(long *)(in_R8 + lVar4 * 8)) {
            if (local_31c != 0) {
              snprintf(local_378,0x51,"ffgsvb: illegal range specified for axis %ld",lVar4 + 1);
              ffpmsg((char *)0x18f721);
              *in_stack_00000028 = 0x141;
              return 0x141;
            }
            local_1f8[lVar4] = -1;
          }
          local_108[lVar4] = *(long *)(in_R8 + lVar4 * 8);
          local_158[lVar4] = *(long *)(&in_R9->HDUposition + lVar4 * 2);
          local_1a8[lVar4] = in_stack_00000008[lVar4];
          alStack_278[lVar4 + 1] = alStack_278[lVar4] * in_RCX[lVar4];
          alStack_278[lVar4] = alStack_278[lVar4] * local_1f8[lVar4];
        }
        alStack_278[(int)in_EDX] = alStack_278[(int)in_EDX] * local_1f8[(int)in_EDX];
        if ((in_EDX == 1) && (*in_RCX == 1)) {
          local_200 = (local_b0 - local_a8) / local_b8;
          local_210 = local_b8;
          local_b0 = local_a8;
        }
        else {
          local_200 = (local_158[0] * local_1f8[0] - local_108[0] * local_1f8[0]) /
                      *in_stack_00000008;
          local_210 = local_1a8[0] * local_1f8[0];
        }
        local_200 = local_200 + 1;
        for (local_a0 = local_a8; local_a0 <= local_b0; local_a0 = local_b8 + local_a0) {
          for (local_98 = local_108[8] * local_1f8[8]; local_98 <= local_158[8] * local_1f8[8];
              local_98 = local_1a8[8] + local_98) {
            for (local_90 = local_108[7] * local_1f8[7]; local_90 <= local_158[7] * local_1f8[7];
                local_90 = local_1a8[7] + local_90) {
              for (local_88 = local_108[6] * local_1f8[6]; local_88 <= local_158[6] * local_1f8[6];
                  local_88 = local_1a8[6] + local_88) {
                for (local_80 = local_108[5] * local_1f8[5]; local_80 <= local_158[5] * local_1f8[5]
                    ; local_80 = local_1a8[5] + local_80) {
                  for (local_78 = local_108[4] * local_1f8[4];
                      local_78 <= local_158[4] * local_1f8[4]; local_78 = local_1a8[4] + local_78) {
                    for (lVar4 = local_108[3] * local_1f8[3]; lVar4 <= local_158[3] * local_1f8[3];
                        lVar4 = local_1a8[3] + lVar4) {
                      for (lVar2 = local_108[2] * local_1f8[2]; lVar2 <= local_158[2] * local_1f8[2]
                          ; lVar2 = local_1a8[2] + lVar2) {
                        for (lVar3 = local_108[1] * local_1f8[1];
                            lVar3 <= local_158[1] * local_1f8[1]; lVar3 = local_1a8[1] + lVar3) {
                          local_220 = local_108[0] + (lVar3 - local_1f8[1]) * alStack_278[1] +
                                      (lVar2 - local_1f8[2]) * alStack_278[2] +
                                      (lVar4 - local_1f8[3]) * alStack_278[3] +
                                      (local_78 - local_1f8[4]) * alStack_278[4] +
                                      (local_80 - local_1f8[5]) * alStack_278[5] +
                                      (local_88 - local_1f8[6]) * alStack_278[6] +
                                      (local_90 - local_1f8[7]) * alStack_278[7] +
                                      (local_98 - local_1f8[8]) * alStack_278[8];
                          iVar1 = ffgclb(in_stack_00006f38,in_stack_00006f34,in_stack_00006f28,
                                         in_stack_00006f20,in_stack_00006f18,in_stack_00006f10,
                                         in_stack_00006f80,in_stack_00006f88,in_stack_00006f90,
                                         in_stack_00006f98,in_stack_00006fa0,in_stack_00006fa8);
                          if (0 < iVar1) {
                            return *in_stack_00000028;
                          }
                          if ((local_320 != 0) && (in_stack_00000020 != (undefined4 *)0x0)) {
                            *in_stack_00000020 = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_1c = *in_stack_00000028;
      }
      else {
        local_1c = *in_stack_00000028;
      }
    }
    else {
      for (lVar4 = 0; lVar4 < (int)in_EDX; lVar4 = lVar4 + 1) {
        local_2c8[lVar4] = *(undefined8 *)(in_R8 + lVar4 * 8);
        local_318[lVar4] = *(undefined8 *)(&in_R9->HDUposition + lVar4 * 2);
      }
      fits_read_compressed_img
                (in_R9,(int)((ulong)lVar4 >> 0x20),in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),unaff_R14,unaff_RBP,unaff_retaddr,
                 (int *)in_stack_00000008,(int *)CONCAT71(in_stack_00000011,in_stack_00000010));
      local_1c = *in_stack_00000028;
    }
  }
  return local_1c;
}

Assistant:

int ffgsvb(fitsfile *fptr, /* I - FITS file pointer                         */
           int  colnum,    /* I - number of the column to read (1 = 1st)    */
           int naxis,      /* I - number of dimensions in the FITS array    */
           long  *naxes,   /* I - size of each dimension                    */
           long  *blc,     /* I - 'bottom left corner' of the subsection    */
           long  *trc,     /* I - 'top right corner' of the subsection      */
           long  *inc,     /* I - increment to be applied in each dimension */
           unsigned char nulval, /* I - value to set undefined pixels       */
           unsigned char *array, /* O - array to be filled and returned     */
           int  *anynul,   /* O - set to 1 if any values are null; else 0   */
           int  *status)   /* IO - error status                             */
/*
  Read a subsection of data values from an image or a table column.
  This routine is set up to handle a maximum of nine dimensions.
*/
{
    long ii, i0, i1, i2, i3, i4, i5, i6, i7, i8, row, rstr, rstp, rinc;
    long str[9], stp[9], incr[9], dir[9];
    long nelem, nultyp, ninc, numcol;
    LONGLONG felem, dsize[10], blcll[9], trcll[9];
    int hdutype, anyf;
    char ldummy, msg[FLEN_ERRMSG];
    int  nullcheck = 1;
    unsigned char nullvalue;

    if (naxis < 1 || naxis > 9)
    {
        snprintf(msg, FLEN_ERRMSG,"NAXIS = %d in call to ffgsvb is out of range", naxis);
        ffpmsg(msg);
        return(*status = BAD_DIMEN);
    }

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        for (ii=0; ii < naxis; ii++) {
	    blcll[ii] = blc[ii];
	    trcll[ii] = trc[ii];
	}

        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TBYTE, blcll, trcll, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

/*
    if this is a primary array, then the input COLNUM parameter should
    be interpreted as the row number, and we will alway read the image
    data from column 2 (any group parameters are in column 1).
*/
    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == IMAGE_HDU)
    {
        /* this is a primary array, or image extension */
        if (colnum == 0)
        {
            rstr = 1;
            rstp = 1;
        }
        else
        {
            rstr = colnum;
            rstp = colnum;
        }
        rinc = 1;
        numcol = 2;
    }
    else
    {
        /* this is a table, so the row info is in the (naxis+1) elements */
        rstr = blc[naxis];
        rstp = trc[naxis];
        rinc = inc[naxis];
        numcol = colnum;
    }

    nultyp = 1;
    if (anynul)
        *anynul = FALSE;

    i0 = 0;
    for (ii = 0; ii < 9; ii++)
    {
        str[ii] = 1;
        stp[ii] = 1;
        incr[ii] = 1;
        dsize[ii] = 1;
        dir[ii] = 1;
    }

    for (ii = 0; ii < naxis; ii++)
    {
      if (trc[ii] < blc[ii])
      {
        if (hdutype == IMAGE_HDU)
        {
           dir[ii] = -1;
        }
        else
        {
          snprintf(msg, FLEN_ERRMSG,"ffgsvb: illegal range specified for axis %ld", ii + 1);
          ffpmsg(msg);
          return(*status = BAD_PIX_NUM);
        }
      }

      str[ii] = blc[ii];
      stp[ii] = trc[ii];
      incr[ii] = inc[ii];
      dsize[ii + 1] = dsize[ii] * naxes[ii];
      dsize[ii] = dsize[ii] * dir[ii];
    }
    dsize[naxis] = dsize[naxis] * dir[naxis];

    if (naxis == 1 && naxes[0] == 1)
    {
      /* This is not a vector column, so read all the rows at once */
      nelem = (rstp - rstr) / rinc + 1;
      ninc = rinc;
      rstp = rstr;
    }
    else
    {
      /* have to read each row individually, in all dimensions */
      nelem = (stp[0]*dir[0] - str[0]*dir[0]) / inc[0] + 1;
      ninc = incr[0] * dir[0];
    }

    for (row = rstr; row <= rstp; row += rinc)
    {
     for (i8 = str[8]*dir[8]; i8 <= stp[8]*dir[8]; i8 += incr[8])
     {
      for (i7 = str[7]*dir[7]; i7 <= stp[7]*dir[7]; i7 += incr[7])
      {
       for (i6 = str[6]*dir[6]; i6 <= stp[6]*dir[6]; i6 += incr[6])
       {
        for (i5 = str[5]*dir[5]; i5 <= stp[5]*dir[5]; i5 += incr[5])
        {
         for (i4 = str[4]*dir[4]; i4 <= stp[4]*dir[4]; i4 += incr[4])
         {
          for (i3 = str[3]*dir[3]; i3 <= stp[3]*dir[3]; i3 += incr[3])
          {
           for (i2 = str[2]*dir[2]; i2 <= stp[2]*dir[2]; i2 += incr[2])
           {
            for (i1 = str[1]*dir[1]; i1 <= stp[1]*dir[1]; i1 += incr[1])
            {

              felem=str[0] + (i1 - dir[1]) * dsize[1] + (i2 - dir[2]) * dsize[2] + 
                             (i3 - dir[3]) * dsize[3] + (i4 - dir[4]) * dsize[4] +
                             (i5 - dir[5]) * dsize[5] + (i6 - dir[6]) * dsize[6] +
                             (i7 - dir[7]) * dsize[7] + (i8 - dir[8]) * dsize[8];

              if ( ffgclb(fptr, numcol, row, felem, nelem, ninc, nultyp,
                   nulval, &array[i0], &ldummy, &anyf, status) > 0)
                   return(*status);

              if (anyf && anynul)
                  *anynul = TRUE;

              i0 += nelem;
            }
           }
          }
         }
        }
       }
      }
     }
    }
    return(*status);
}